

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O3

void vociadd(voccxdef *ctx,objnum obj,objnum loc,int numsc,objnum *sc,int flags)

{
  anon_union_8_2_176b10ea_for_vociu *paVar1;
  byte bVar2;
  vocidef *in_RAX;
  vocidef **__s;
  uchar *puVar3;
  vocidef *pvVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined6 in_register_00000032;
  vocidef *pvVar8;
  vocidef *pvVar9;
  
  uVar6 = CONCAT62(in_register_00000032,obj) >> 8 & 0xffffff;
  if (ctx->voccxinh[uVar6] == (vocidef **)0x0) {
    __s = (vocidef **)mchalo(ctx->voccxerr,0x800,"vocialo");
    ctx->voccxinh[uVar6] = __s;
    in_RAX = (vocidef *)memset(__s,0,0x800);
  }
  if (ctx->voccxifr != (vocidef *)0x0) {
    pvVar8 = (vocidef *)0x0;
    pvVar4 = (vocidef *)0x0;
    pvVar9 = ctx->voccxifr;
    do {
      bVar2 = pvVar9->vocinsc;
      if ((uint)bVar2 == numsc) goto LAB_001376d1;
      if ((numsc < (int)(uint)bVar2) && ((pvVar8 == (vocidef *)0x0 || (bVar2 < pvVar8->vocinsc)))) {
        in_RAX = pvVar4;
        pvVar8 = pvVar9;
      }
      paVar1 = &pvVar9->vociu;
      pvVar4 = pvVar9;
      pvVar9 = paVar1->vociunxt;
    } while (paVar1->vociunxt != (vocidef *)0x0);
    pvVar4 = in_RAX;
    pvVar9 = pvVar8;
    if (pvVar8 != (vocidef *)0x0) {
LAB_001376d1:
      if (pvVar4 == (vocidef *)0x0) {
        ctx->voccxifr = (vocidef *)pvVar9->vociu;
      }
      else {
        pvVar4->vociu = pvVar9->vociu;
      }
      goto LAB_001376e8;
    }
  }
  uVar7 = numsc * 2 + 0x15U & 0xfffffff8;
  uVar5 = ctx->voccxilst;
  if (0x1fff < uVar5 + uVar7) {
    puVar3 = mchalo(ctx->voccxerr,0x2000,"vociadd");
    uVar5 = ctx->voccxiplst + 1;
    ctx->voccxiplst = uVar5;
    ctx->voccxip[uVar5] = puVar3;
    ctx->voccxilst = 0;
    uVar5 = 0;
  }
  pvVar9 = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + uVar5);
  ctx->voccxilst = uVar7 + uVar5;
LAB_001376e8:
  if (ctx->voccxinh[obj >> 8][(ulong)obj & 0xff] != (vocidef *)0x0) {
    errsigf(ctx->voccxerr,"TADS",0x1c2);
  }
  (pvVar9->vociu).vocius.vociusloc = loc;
  (pvVar9->vociu).vocius.vociusilc = 0xffff;
  (pvVar9->vociu).vocius.vociusflg = (byte)flags & 0xfb;
  pvVar9->vocinsc = (uchar)numsc;
  if (numsc != 0) {
    if ((flags & 4U) == 0) {
      memcpy((void *)((long)&pvVar9->vociu + 6),sc,(long)numsc * 2);
    }
    else if (0 < numsc) {
      uVar6 = 0;
      do {
        *(objnum *)((long)&pvVar9->vociu + uVar6 * 2 + 6) = sc[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)numsc != uVar6);
    }
  }
  ctx->voccxinh[obj >> 8][(ulong)obj & 0xff] = pvVar9;
  return;
}

Assistant:

void vociadd(voccxdef *ctx, objnum obj, objnum loc,
             int numsc, objnum *sc, int flags)
{
    vocidef *v;
    vocidef *min;
    vocidef *prv;
    vocidef *minprv;

    /* make sure we have a page table entry for this object */
    vocialo(ctx, obj);

    /* look in free list for an entry that's big enough */
    for (prv = (vocidef *)0, min = (vocidef *)0, v = ctx->voccxifr ; v ;
         prv = v, v = v->vocinxt)
    {
        if (v->vocinsc == numsc)
        {
            min = v;
            minprv = prv;
            break;
        }
        else if (v->vocinsc > numsc)
        {
            if (!min || v->vocinsc < min->vocinsc)
            {
                min = v;
                minprv = prv;
            }
        }
    }
    
    if (!min)
    {
        uint need;
        
        /* nothing in free list; allocate a new entry */
        need = osrndsz(sizeof(vocidef) + (numsc - 1)*sizeof(objnum));
        if (ctx->voccxilst + need >= VOCISIZ)
        {
            /* nothing left on current page; allocate a new page */
            ctx->voccxip[++(ctx->voccxiplst)] =
                mchalo(ctx->voccxerr, VOCISIZ, "vociadd");
            ctx->voccxilst = 0;
        }

        /* allocate space out of current page */
        v = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + ctx->voccxilst);
        ctx->voccxilst += need;
    }
    else
    {
        /* unlink from chain and use */
        v = min;
        if (minprv)
            minprv->vocinxt = v->vocinxt;
        else
            ctx->voccxifr = v->vocinxt;
    }

    /* set up the entry */
    if (vocinh(ctx, obj) != (vocidef *)0) errsig(ctx->voccxerr, ERR_VOCINUS);
    v->vociloc = loc;
    v->vociilc = MCMONINV;
    v->vociflg = (flags & ~VOCIFXLAT);
    v->vocinsc = numsc;
    if (numsc)
    {
        if (flags & VOCIFXLAT)
        {
            int i;
            
            for (i = 0 ; i < numsc ; ++i)
                v->vocisc[i] = osrp2(&sc[i]);
        }
        else
            memcpy(v->vocisc, sc, (size_t)(numsc * sizeof(objnum)));
    }
    vocinh(ctx, obj) = v;                           /* set page table entry */
}